

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif,char *yang_data_name)

{
  uint8_t *puVar1;
  undefined2 uVar2;
  LYS_NODE LVar3;
  ly_module_data_clb p_Var4;
  lys_node_augment *plVar5;
  byte *__s;
  bool bVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  lys_node_leaf *node;
  lys_module *plVar10;
  lys_node *plVar11;
  lys_node_leaf *last;
  undefined8 *puVar12;
  lyd_node *plVar13;
  lys_node_list *plVar14;
  char *pcVar15;
  lyd_attr *plVar16;
  long lVar17;
  size_t sVar18;
  hash_table *phVar19;
  byte *pbVar20;
  lyxml_elem *plVar21;
  LY_VLOG_ELEM LVar22;
  lyd_node **first_sibling_00;
  lyxml_attr *plVar23;
  lyxml_elem *plVar24;
  LY_ECODE LVar25;
  ly_ctx *plVar26;
  void *pvVar27;
  char *pcVar28;
  ulong uVar29;
  lyd_attr *plVar30;
  bool bVar31;
  lyd_node *local_78;
  lyd_node *first_sibling_local;
  lyd_attr *plStack_68;
  int editbits;
  lyd_attr *dattr;
  lyd_node *local_58;
  lyxml_elem *local_50;
  ulong local_48;
  byte local_39;
  ly_ctx *plStack_38;
  uint8_t pos;
  
  first_sibling_local._4_4_ = 0;
  local_78 = first_sibling;
  if (xml == (lyxml_elem *)0x0) {
    __assert_fail("xml",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7a,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  if (result == (lyd_node **)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7b,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if (((uint)options >> 9 & 1) == 0) {
      return 0;
    }
    pcVar15 = "XML element with mixed content";
    LVar25 = LYE_XML_INVAL;
    LVar22 = LY_VLOG_XML;
    goto LAB_0013ff7e;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (pcVar15 = xml->ns->value, pcVar15 == (char *)0x0)) {
    if (((uint)options >> 9 & 1) != 0) {
      ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  local_50 = (lyxml_elem *)parent;
  local_48 = (ulong)(uint)options;
  if (parent != (lyd_node *)0x0) {
    node = (lys_node_leaf *)xml_data_search_schemanode(xml,parent->schema->child,options);
    if (ctx->data_clb != (ly_module_data_clb)0x0) {
      if (node == (lys_node_leaf *)0x0) {
        node = (lys_node_leaf *)0x0;
        first_sibling = (lyd_node *)0x0;
        plVar10 = (*ctx->data_clb)(ctx,(char *)0x0,xml->ns->value,0,ctx->data_clb_data);
        if (plVar10 != (lys_module *)0x0) {
          plVar11 = *(lys_node **)(*(long *)local_50 + 0x48);
          options = (int)local_48;
LAB_0013fdad:
          node = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar11,options);
        }
      }
      else {
        plVar10 = lys_node_module((lys_node *)node);
        if ((plVar10->field_0x40 & 0x80) == 0) {
          p_Var4 = ctx->data_clb;
          plVar10 = lys_node_module((lys_node *)node);
          pcVar15 = plVar10->name;
          plVar10 = lys_node_module((lys_node *)node);
          first_sibling = (lyd_node *)0x0;
          (*p_Var4)(ctx,pcVar15,plVar10->ns,1,ctx->data_clb_data);
        }
      }
    }
    goto LAB_0013fee8;
  }
  plVar13 = (lyd_node *)0x0;
  plVar10 = ly_ctx_get_module_by_ns(ctx,pcVar15,(char *)0x0,0);
  first_sibling = plVar13;
  if (ctx->data_clb != (ly_module_data_clb)0x0) {
    if (plVar10 == (lys_module *)0x0) {
      pcVar28 = xml->ns->value;
      pvVar27 = ctx->data_clb_data;
      pcVar15 = (char *)0x0;
      first_sibling = (lyd_node *)0x0;
    }
    else {
      if ((plVar10->field_0x40 & 0x80) != 0) goto LAB_0013fdd3;
      pcVar15 = plVar10->name;
      pcVar28 = plVar10->ns;
      pvVar27 = ctx->data_clb_data;
      first_sibling = (lyd_node *)&DAT_00000001;
    }
    plVar10 = (*ctx->data_clb)(ctx,pcVar15,pcVar28,(int)first_sibling,pvVar27);
  }
LAB_0013fdd3:
  if ((plVar10 == (lys_module *)0x0) || ((*(ushort *)&plVar10->field_0x40 & 0xc0) != 0x80)) {
LAB_0013fee5:
    node = (lys_node_leaf *)0x0;
  }
  else {
    if (((uint)options >> 0x18 & 1) != 0) {
      if (yang_data_name != (char *)0x0) {
        sVar18 = strlen(yang_data_name);
        plVar11 = lyp_get_yang_data_template(plVar10,yang_data_name,(int)sVar18);
        if (plVar11 != (lys_node *)0x0) {
          puVar12 = (undefined8 *)
                    lys_ext_complex_get_substmt
                              (LY_STMT_CONTAINER,(lys_ext_instance_complex *)plVar11,
                               (lyext_substmt **)0x0);
          plVar11 = (lys_node *)*puVar12;
          goto LAB_0013fdad;
        }
      }
      goto LAB_0013fee5;
    }
    node = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar10->data,options);
    if (node == (lys_node_leaf *)0x0) {
      if (plVar10->augment_size == '\0') goto LAB_0013fee5;
      uVar29 = 0;
      plStack_38 = ctx;
      do {
        plVar5 = plVar10->augment;
        plVar11 = plVar5[uVar29].target;
        if ((plVar11->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
LAB_0013fe5b:
          node = (lys_node_leaf *)0x0;
        }
        else {
          for (; plVar11 != (lys_node *)0x0; plVar11 = lys_parent(plVar11)) {
            uVar2 = (undefined2)plVar11->nodetype;
            first_sibling = (lyd_node *)(ulong)(ushort)uVar2;
            if ((uVar2 & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) goto LAB_0013fe5b;
          }
          last = (lys_node_leaf *)0x0;
          do {
            first_sibling = (lyd_node *)0x0;
            last = (lys_node_leaf *)
                   lys_getnext((lys_node *)last,(lys_node *)(plVar5 + uVar29),(lys_module *)0x0,0);
            node = (lys_node_leaf *)0x0;
            if (last == (lys_node_leaf *)0x0) break;
            first_sibling = (lyd_node *)last->name;
            node = last;
          } while (first_sibling != (lyd_node *)xml->name);
        }
        ctx = plStack_38;
        if (node != (lys_node_leaf *)0x0) break;
        uVar29 = uVar29 + 1;
        node = (lys_node_leaf *)0x0;
      } while (uVar29 < plVar10->augment_size);
    }
  }
LAB_0013fee8:
  plVar10 = lys_node_module((lys_node *)node);
  if ((plVar10 == (lys_module *)0x0) || ((*(ushort *)&plVar10->field_0x40 & 0xc0) != 0x80)) {
    if (((uint)local_48 >> 9 & 1) == 0) {
      return 0;
    }
    plVar21 = (lyxml_elem *)0x1a2840;
    if (local_50 != (lyxml_elem *)0x0) {
      plVar21 = local_50;
    }
    LVar22 = (local_50 == (lyxml_elem *)0x0) + LY_VLOG_LYD;
    pcVar15 = xml->name;
    LVar25 = LYE_INELEM;
    xml = plVar21;
LAB_0013ff7e:
    ly_vlog(ctx,LVar25,LVar22,xml,pcVar15);
    return -1;
  }
  LVar3 = node->nodetype;
  plStack_38 = ctx;
  if ((int)LVar3 < 0x20) {
    if ((int)LVar3 < 8) {
      if (LVar3 != LYS_CONTAINER) {
        if (LVar3 != LYS_LEAF) {
LAB_00140006:
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                 ,0xfe);
          return -1;
        }
LAB_00140031:
        sVar18 = 0x50;
        goto LAB_00140047;
      }
    }
    else {
      if (LVar3 == LYS_LEAFLIST) goto LAB_00140031;
      if (LVar3 != LYS_LIST) goto LAB_00140006;
    }
LAB_0013ffbf:
    __s = (byte *)xml->content;
    pbVar20 = __s;
    while (__s != (byte *)0x0) {
      uVar29 = (ulong)*pbVar20;
      if (0x20 < uVar29) {
LAB_00140524:
        sVar18 = strlen((char *)__s);
        pcVar15 = (char *)malloc(sVar18 + 0x17);
        if (pcVar15 != (char *)0x0) {
          sprintf(pcVar15,"node with text data \"%s\"",__s);
          ly_vlog(plStack_38,LYE_XML_INVAL,LY_VLOG_XML,xml,pcVar15);
          free(pcVar15);
          return -1;
        }
        goto LAB_00140579;
      }
      if ((0x100002600U >> (uVar29 & 0x3f) & 1) == 0) {
        if (uVar29 != 0) goto LAB_00140524;
        break;
      }
      pbVar20 = pbVar20 + 1;
    }
    plVar13 = (lyd_node *)calloc(1,0x48);
    dattr._4_4_ = 0;
  }
  else {
    if (0xff < (int)LVar3) {
      if (LVar3 != LYS_RPC) {
        if (LVar3 == LYS_ANYDATA) goto LAB_0014003d;
        if (LVar3 != LYS_ACTION) goto LAB_00140006;
      }
      goto LAB_0013ffbf;
    }
    if (LVar3 != LYS_ANYXML) {
      if (LVar3 != LYS_NOTIF) goto LAB_00140006;
      goto LAB_0013ffbf;
    }
LAB_0014003d:
    sVar18 = 0x40;
LAB_00140047:
    plVar13 = (lyd_node *)calloc(1,sVar18);
    dattr._4_4_ = (undefined4)CONCAT71((int7)((ulong)first_sibling >> 8),1);
  }
  plVar21 = local_50;
  *result = plVar13;
  if (plVar13 == (lyd_node *)0x0) {
LAB_00140579:
    ly_log(plStack_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xml_parse_data");
    return -1;
  }
  plVar13->prev = plVar13;
  (*result)->schema = (lys_node *)node;
  (*result)->parent = (lyd_node *)local_50;
  local_58 = (lyd_node *)0x0;
  if ((LVar3 == LYS_LEAF) && (plVar14 = lys_is_key(node,&local_39), plVar14 != (lys_node_list *)0x0)
     ) {
    if (plVar21 == (lyxml_elem *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                    ,0x109,
                    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                   );
    }
    local_58 = (lyd_node *)plVar21->content;
    if ((local_58 != (lyd_node *)0x0) && (local_39 != 0)) {
      uVar9 = 1;
      do {
        if (((((lys_node_leaf *)local_58->schema)->nodetype != LYS_LEAF) ||
            (plVar14 = lys_is_key((lys_node_leaf *)local_58->schema,(uint8_t *)0x0),
            plVar14 == (lys_node_list *)0x0)) ||
           (local_58 = local_58->next, local_58 == (lyd_node *)0x0)) break;
        bVar31 = uVar9 < local_39;
        uVar9 = uVar9 + 1;
      } while (bVar31);
    }
    plVar26 = plStack_38;
    if (local_58 != (lyd_node *)0x0) {
      if (((uint)local_48 >> 9 & 1) != 0) {
        ly_vlog(plStack_38,LYE_INORDER,LY_VLOG_LYD,*result,node->name,local_58->schema->name);
        ly_vlog(plVar26,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "Invalid position of the key \"%s\" in a list \"%s\".",node->name,
                **(undefined8 **)plVar21);
        free(*result);
        *result = (lyd_node *)0x0;
        return -1;
      }
      ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,"Invalid position of the key \"%s\" in a list \"%s\".",
             node->name,**(undefined8 **)plVar21);
      if ((lyd_node *)plVar21->content == local_58) {
        plVar21->content = (char *)*result;
        local_78 = *result;
      }
      plVar13 = local_58->prev;
      if (plVar13->next != (lyd_node *)0x0) {
        plVar13->next = *result;
      }
      (*result)->prev = plVar13;
      local_58->prev = *result;
      (*result)->next = local_58;
    }
  }
  if (local_58 == (lyd_node *)0x0) {
    if ((plVar21 != (lyxml_elem *)0x0) && ((lyd_node *)plVar21->content == (lyd_node *)0x0)) {
      plVar21->content = (char *)*result;
    }
    plVar13 = *result;
    if (prev == (lyd_node *)0x0) {
      plVar13->prev = plVar13;
      local_78 = *result;
    }
    else {
      plVar13->prev = prev;
      prev->next = *result;
      local_78->prev = *result;
    }
  }
  iVar7 = ly_new_node_validity((*result)->schema);
  (*result)->validity = (uint8_t)iVar7;
  iVar7 = resolve_applies_when((lys_node *)node,0,(lys_node *)0x0);
  if (iVar7 != 0) {
    (*result)->field_0x9 = (*result)->field_0x9 & 0xf1 | 8;
  }
  plVar23 = xml->attr;
  if (plVar23 == (lyxml_attr *)0x0) {
    bVar31 = true;
  }
  else {
    bVar6 = false;
    do {
      bVar31 = bVar6;
      if (plVar23->type == LYXML_ATTR_STD) {
        if (plVar23->ns == (lyxml_ns *)0x0) {
          if (((*result)->schema->nodetype == LYS_ANYXML) &&
             (iVar7 = ly_strequal_((*result)->schema->name,"filter"), iVar7 != 0)) {
            iVar7 = ly_strequal_((*result)->schema->module->name,"ietf-netconf");
            bVar31 = true;
            if (iVar7 == 0) {
              iVar7 = ly_strequal_((*result)->schema->module->name,"notifications");
              pcVar15 = "urn:ietf:params:xml:ns:netconf:base:1.0";
              if (iVar7 == 0) goto LAB_00140366;
            }
            else {
              pcVar15 = "urn:ietf:params:xml:ns:netconf:base:1.0";
            }
            goto LAB_00140243;
          }
        }
        else {
          pcVar15 = plVar23->ns->value;
LAB_00140243:
          iVar7 = lyp_fill_attr(plStack_38,*result,pcVar15,(char *)0x0,plVar23->name,plVar23->value,
                                xml,(int)local_48,&stack0xffffffffffffff98);
          bVar6 = bVar31;
          if (iVar7 != 1) {
            if (iVar7 == -1) goto LAB_00140a2c;
            if ((bVar31) &&
               (iVar7 = strcmp(plVar23->name,"select"), plVar26 = plStack_38, iVar7 == 0)) {
              pcVar15 = transform_xml2json(plStack_38,plStack_68->value_str,xml,0,0);
              (plStack_68->value).binary = pcVar15;
              if (pcVar15 == (char *)0x0) {
                plStack_68->value = (lyd_val)plStack_68->value_str;
                goto LAB_00140a2c;
              }
              lydict_remove(plVar26,plStack_68->value_str);
              plStack_68->value_str = (char *)plStack_68->value;
            }
            plVar30 = (*result)->attr;
            if (plVar30 == (lyd_attr *)0x0) {
              (*result)->attr = plStack_68;
            }
            else {
              do {
                plVar16 = plVar30;
                plVar30 = plVar16->next;
              } while (plVar30 != (lyd_attr *)0x0);
              plVar16->next = plStack_68;
            }
            goto LAB_001403ba;
          }
        }
LAB_00140366:
        if (((uint)local_48 >> 9 & 1) != 0) {
          ly_vlog(plStack_38,LYE_INATTR,LY_VLOG_LYD,*result,plVar23->name);
          goto LAB_00140a2c;
        }
        pcVar15 = "<none>";
        if (plVar23->ns != (lyxml_ns *)0x0) {
          pcVar15 = plVar23->ns->prefix;
        }
        ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,
               "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",pcVar15,plVar23->name,
               plVar23->value);
        bVar31 = bVar6;
      }
LAB_001403ba:
      plVar23 = plVar23->next;
      bVar6 = bVar31;
    } while (plVar23 != (lyxml_attr *)0x0);
    bVar31 = !bVar31;
  }
  if ((local_48 & 8) == 0) {
    if (bVar31) {
switchD_00140631_caseD_1:
      plVar26 = plStack_38;
      LVar3 = node->nodetype;
      if ((LVar3 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        if ((LVar3 & LYS_ANYDATA) == LYS_UNKNOWN) {
          if ((LVar3 & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
            if (LVar3 != LYS_NOTIF) goto LAB_0014087a;
            if (((local_48 & 0x40) == 0) || (*act_notif != (lyd_node *)0x0)) {
              ly_vlog(plStack_38,LYE_INELEM,LY_VLOG_LYD,*result,node->name);
              pcVar15 = node->name;
              pcVar28 = "Unexpected notification node \"%s\".";
              LVar25 = LYE_SPEC;
              LVar22 = LY_VLOG_PREV;
              plVar21 = (lyxml_elem *)0x0;
              goto LAB_001407c6;
            }
          }
          else if (((local_48 & 0x10) == 0) || (*act_notif != (lyd_node *)0x0)) {
            ly_vlog(plStack_38,LYE_INELEM,LY_VLOG_LYD,*result,node->name);
            pcVar15 = "action";
            if (node->nodetype == LYS_RPC) {
              pcVar15 = "rpc";
            }
            ly_vlog(plVar26,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Unexpected %s node \"%s\".",pcVar15,
                    node->name);
            goto LAB_00140a2c;
          }
          *act_notif = *result;
        }
        else {
          plVar21 = xml->child;
          if (plVar21 == (lyxml_elem *)0x0) {
            *(undefined4 *)&(*result)->field_0x34 = 0;
            phVar19 = (hash_table *)lydict_insert(plStack_38,xml->content,0);
            (*result)->ht = phVar19;
          }
          else {
            xml->child = (lyxml_elem *)0x0;
            plVar24 = plVar21;
            do {
              plVar24->parent = (lyxml_elem *)0x0;
              lyxml_correct_elem_ns(plVar26,plVar24,1,1);
              plVar24 = plVar24->next;
            } while (plVar24 != (lyxml_elem *)0x0);
            plVar13 = *result;
            *(undefined4 *)&plVar13->field_0x34 = 8;
            plVar13->ht = (hash_table *)plVar21;
          }
        }
      }
      else {
        iVar7 = xml_get_value(*result,xml,first_sibling_local._4_4_,(uint)local_48 & 0x2000);
        if (iVar7 != 0) goto LAB_00140a2c;
      }
LAB_0014087a:
      plVar11 = (*result)->schema;
      if ((plVar11->nodetype != LYS_LIST) || (plVar11->padding[2] == '\0')) {
        lyd_hash(*result);
        lyd_insert_hash(*result);
      }
      iVar7 = lyv_data_context(*result,(int)local_48,unres);
      uVar29 = local_48;
      if (iVar7 == 0) {
        if ((dattr._4_1_ == '\0') && (xml->child != (lyxml_elem *)0x0)) {
          local_58 = (lyd_node *)0x0;
          plVar21 = xml->child;
          plVar13 = (lyd_node *)0x0;
          while (plVar21 != (lyxml_elem *)0x0) {
            plVar24 = plVar21->next;
            iVar7 = xml_parse_data(plStack_38,plVar21,*result,(*result)->child,plVar13,(uint)uVar29,
                                   unres,&local_58,act_notif,yang_data_name);
            if (iVar7 != 0) goto LAB_00140a39;
            if (((uint)uVar29 >> 10 & 1) != 0) {
              lyxml_free(plStack_38,plVar21);
            }
            plVar21 = plVar24;
            if ((local_58 != (lyd_node *)0x0) && (local_58->next == (lyd_node *)0x0)) {
              plVar13 = local_58;
            }
          }
        }
        if ((((node->nodetype == LYS_CONTAINER) &&
             (plVar13 = *result, plVar13->child == (lyd_node *)0x0)) &&
            (plVar13->attr == (lyd_attr *)0x0)) && ((node->type).ext == (lys_ext_instance **)0x0)) {
          plVar13->field_0x9 = plVar13->field_0x9 | 1;
        }
        iVar7 = lyv_data_content(*result,(int)local_48,unres);
        if (iVar7 == 0) {
          first_sibling_00 = &local_78;
          if (prev == (lyd_node *)0x0) {
            first_sibling_00 = (lyd_node **)0x0;
          }
          iVar7 = lyv_multicases(*result,(lys_node *)0x0,first_sibling_00,0,(lyd_node *)0x0);
          if (iVar7 == 0) {
            if (((*result)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
              puVar1 = &(*result)->validity;
              *puVar1 = *puVar1 | 1;
              return 0;
            }
            return 0;
          }
        }
      }
      goto LAB_00140a39;
    }
    local_50 = (lyxml_elem *)*result;
    plVar30 = (lyd_attr *)local_50->attr;
    if (plVar30 == (lyd_attr *)0x0) {
      uVar8 = 0;
    }
    else {
      lVar17 = 0;
      do {
        pcVar15 = plVar30->name;
        iVar7 = strcmp(pcVar15,"type");
        uVar9 = (uint)lVar17;
        if (iVar7 == 0) {
          if ((uVar9 < 5) && ((0x16U >> uVar9 & 1) != 0)) {
            ly_vlog(plStack_38,LYE_TOOMANY,LY_VLOG_LYD,local_50,"type",xml->name);
            goto LAB_00140a2c;
          }
          iVar7 = ((plVar30->value).enm)->value;
          if (iVar7 == 1) {
            if (uVar9 == 0) {
              lVar17 = 2;
            }
            else {
              lVar17 = 4;
              if (uVar9 != 3) {
                __assert_fail("!found",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                              ,0x195,
                              "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                             );
              }
            }
          }
          else {
            if (iVar7 != 0) {
              ly_log(plStack_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                     ,0x19a);
              goto LAB_00140a2c;
            }
            lVar17 = 1;
            if (uVar9 != 0) {
              if (uVar9 != 3) {
                __assert_fail("!found",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                              ,0x18d,
                              "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                             );
              }
              ly_vlog(plStack_38,LYE_INATTR,LY_VLOG_LYD,local_50,pcVar15);
              goto LAB_00140a2c;
            }
          }
        }
        else {
          iVar7 = strcmp(pcVar15,"select");
          if (iVar7 == 0) {
            iVar7 = (*(code *)((long)&DAT_001a8584 + (long)(int)(&DAT_001a8584)[lVar17]))();
            return iVar7;
          }
        }
        plVar30 = plVar30->next;
        uVar8 = (undefined4)lVar17;
      } while (plVar30 != (lyd_attr *)0x0);
    }
    switch(uVar8) {
    case 1:
    case 4:
      goto switchD_00140631_caseD_1;
    case 2:
      pcVar15 = xml->name;
      pcVar28 = "select";
      break;
    case 3:
      pcVar15 = xml->name;
      pcVar28 = "type";
      break;
    default:
      ly_log(plStack_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
             ,0x1c0);
      goto LAB_00140a2c;
    }
    LVar25 = LYE_MISSATTR;
    LVar22 = LY_VLOG_LYD;
    plVar21 = local_50;
    plVar26 = plStack_38;
LAB_001407c6:
    ly_vlog(plVar26,LVar25,LVar22,plVar21,pcVar28,pcVar15);
  }
  else {
    iVar7 = lyp_check_edit_attr(plStack_38,(*result)->attr,*result,
                                (int *)((long)&first_sibling_local + 4));
    if (iVar7 == 0) goto switchD_00140631_caseD_1;
  }
LAB_00140a2c:
  lyd_unlink_internal(*result,2);
LAB_00140a39:
  uVar9 = unres->count - 1;
  if (-1 < (int)uVar9) {
    uVar29 = (ulong)uVar9;
    do {
      if (unres->node[uVar29] == *result) {
        unres_data_del(unres,(uint32_t)uVar29);
      }
      bVar31 = 0 < (long)uVar29;
      uVar29 = uVar29 - 1;
    } while (bVar31);
  }
  lyd_free(*result);
  *result = (lyd_node *)0x0;
  return -1;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif, const char *yang_data_name)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    const struct lys_node *ext_node;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, filterflag = 0, found;
    uint8_t pos;
    int ret = 0;
    const char *str = NULL;
    char *msg;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL, 0);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            if (options & LYD_OPT_DATA_TEMPLATE) {
                if (yang_data_name) {
                    ext_node = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
                    if (ext_node) {
                        schema = *((struct lys_node **) lys_ext_complex_get_substmt(LY_STMT_CONTAINER, (struct lys_ext_instance_complex *)ext_node, NULL));
                        schema = xml_data_search_schemanode(xml, schema, options);
                    }
                }
            } else {
                schema = xml_data_search_schemanode(xml, mod->data, options);
                if (!schema) {
                    /* it still can be the specific case of this module containing an augment of another module
                    * top-level choice or top-level choice's case, bleh */
                    for (j = 0; j < mod->augment_size; ++j) {
                        aug = &mod->augment[j];
                        target = aug->target;
                        if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                            /* 1) okay, the target is choice or case */
                            while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                                target = lys_parent(target);
                            }
                            /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                            if (!target) {
                                while ((schema = (struct lys_node *) lys_getnext(schema, (struct lys_node *) aug, NULL, 0))) {
                                    /* 3) alright, even the name matches, we found our schema node */
                                    if (ly_strequal(schema->name, xml->name, 1)) {
                                        break;
                                    }
                                }
                            }
                        }

                        if (schema) {
                            break;
                        }
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (ctx->data_clb) {
            if (schema && !lys_node_module(schema)->implemented) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            } else if (!schema) {
                if (ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data)) {
                    /* context was updated, so try to find the schema node again */
                    schema = xml_data_search_schemanode(xml, parent->schema->child, options);
                }
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_STR), (parent ? (void *)parent : (void *)"/") , xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        for (i = 0; xml->content && xml->content[i]; ++i) {
            if (!is_xmlws(xml->content[i])) {
                msg = malloc(22 + strlen(xml->content) + 1);
                LY_CHECK_ERR_RETURN(!msg, LOGMEM(ctx), -1);
                sprintf(msg, "node with text data \"%s\"", xml->content);
                LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, msg);
                free(msg);
                return -1;
            }
        }
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT(ctx);
        return -1;
    }
    LY_CHECK_ERR_RETURN(!(*result), LOGMEM(ctx), -1);

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)schema, &pos)) {
        /* it is key and we need to insert it into a correct place (a key must have a parent list) */
        assert(parent);
        for (i = 0, diter = parent->child;
                diter && i < pos && diter->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)diter->schema, NULL);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN(ctx, "Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, options, &dattr);
        if (r == -1) {
            goto unlink_node_error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, *result, attr->name);
                goto unlink_node_error;
            }

            LOGWRN(ctx, "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 0);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto unlink_node_error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto unlink_node_error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto unlink_node_error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto unlink_node_error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto unlink_node_error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto unlink_node_error;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto unlink_node_error;
        case 3:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto unlink_node_error;
        default:
            LOGINT(ctx);
            goto unlink_node_error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits, options & LYD_OPT_TRUSTED)) {
            goto unlink_node_error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if (((*result)->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)(*result)->schema)->keys_size) {
        lyd_hash(*result);
        lyd_insert_hash(*result);
    }
#endif

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif, yang_data_name);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    if (lyv_data_content(*result, options, unres) ||
            lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        goto error;
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_DUP;
    }

    return ret;

unlink_node_error:
    lyd_unlink_internal(*result, 2);
error:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;
    return -1;
}